

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAbstractButtonListModel.cpp
# Opt level: O0

bool __thiscall
QAbstractButtonListModel::removeRows
          (QAbstractButtonListModel *this,int row,int count,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QModelIndex *in_RCX;
  int in_EDX;
  int in_ESI;
  QModelIndex *in_RDI;
  QModelIndex local_38;
  QModelIndex *local_20;
  int local_14;
  
  if ((((0 < in_EDX) && (-1 < in_ESI)) &&
      (local_20 = in_RCX, local_14 = in_ESI,
      iVar2 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_RCX), in_ESI + in_EDX <= iVar2)) &&
     (bVar1 = QModelIndex::isValid(local_20), !bVar1)) {
    QModelIndex::QModelIndex(&local_38);
    QAbstractItemModel::beginRemoveRows(in_RDI,(int)&local_38,local_14);
    QList<QMap<int,_QVariant>_>::remove
              ((QList<QMap<int,_QVariant>_> *)(*(long *)(in_RDI + 0x10) + 0x18),
               (char *)(long)local_14);
    QAbstractItemModel::endRemoveRows();
    return true;
  }
  return false;
}

Assistant:

bool QAbstractButtonListModel::removeRows(int row, int count, const QModelIndex &parent) {
    if (count < 1 || row < 0 || (row + count) > rowCount(parent) || parent.isValid()) {
        return false;
    }

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    d->buttons.remove(row, count);
    endRemoveRows();

    return true;
}